

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultVerify.cpp
# Opt level: O0

void mult_verify::MultVerifyUint64Int(void)

{
  bool bVar1;
  TestCase<unsigned_long,_int,_0> TVar2;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  uint64_t ret;
  TestCase<unsigned_long,_int,_0> test;
  TestVector<unsigned_long,_int,_0> tests;
  allocator *in_stack_ffffffffffffff18;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_ffffffffffffff20;
  TestVector<unsigned_long,_int,_0> *in_stack_ffffffffffffff28;
  unsigned_long local_c8;
  int local_c0;
  bool bStack_bc;
  allocator local_a1;
  string local_a0 [32];
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_80;
  byte local_75;
  allocator<char> local_61;
  string local_60 [3];
  undefined1 in_stack_ffffffffffffffa3;
  int in_stack_ffffffffffffffa4;
  unsigned_long in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb0;
  unsigned_long local_38;
  int local_30;
  bool bStack_2c;
  unsigned_long local_28;
  int local_20;
  byte local_1c;
  TestVector<unsigned_long,_int,_0> local_18;
  
  TestVector<unsigned_long,_int,_0>::TestVector(&local_18);
  TVar2 = TestVector<unsigned_long,_int,_0>::GetNext(in_stack_ffffffffffffff28);
  local_38 = TVar2.x;
  local_28 = local_38;
  local_30 = TVar2.y;
  local_20 = local_30;
  bStack_2c = TVar2.fExpected;
  local_1c = bStack_2c;
  while( true ) {
    bVar1 = TestVector<unsigned_long,_int,_0>::Done(&local_18);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = SafeMultiply<unsigned_long,int>
                      ((unsigned_long)in_stack_ffffffffffffff20,
                       (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),(unsigned_long *)0x1aebe3);
    if (bVar1 != (bool)(local_1c & 1)) {
      in_stack_ffffffffffffff28 = (TestVector<unsigned_long,_int,_0> *)&local_61;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_60,"Error in case uint64_int32: ",(allocator *)in_stack_ffffffffffffff28);
      err_msg<unsigned_long,int>
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                 (bool)in_stack_ffffffffffffffa3);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator(&local_61);
    }
    local_75 = 1;
    in_stack_ffffffffffffff20 = &local_80;
    SafeInt<unsigned_long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
    SafeInt(in_stack_ffffffffffffff20,&local_28);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator*=(in_stack_ffffffffffffff20,(int)((ulong)in_stack_ffffffffffffff18 >> 0x20));
    if ((local_75 & 1) != (local_1c & 1)) {
      in_stack_ffffffffffffff18 = &local_a1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_a0,"Error in case uint64_int32 throw: ",in_stack_ffffffffffffff18);
      err_msg<unsigned_long,int>
                (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,
                 (bool)in_stack_ffffffffffffffa3);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&local_a1);
    }
    TVar2 = TestVector<unsigned_long,_int,_0>::GetNext(in_stack_ffffffffffffff28);
    local_c8 = TVar2.x;
    local_c0 = TVar2.y;
    bStack_bc = TVar2.fExpected;
    local_28 = local_c8;
    local_20 = local_c0;
    local_1c = bStack_bc;
  }
  return;
}

Assistant:

void MultVerifyUint64Int()
{
	TestVector< std::uint64_t, std::int32_t, OpType::Mult > tests;
	TestCase<std::uint64_t, std::int32_t, OpType::Mult > test = tests.GetNext();

	while (!tests.Done())
	{
		std::uint64_t ret;
		if( SafeMultiply(test.x, test.y, ret) != test.fExpected )
		{
			//assert(false);
			err_msg( "Error in case uint64_int32: ", test.x, test.y, test.fExpected );
		}

		bool fSuccess = true;
		try
		{
			SafeInt<std::uint64_t> si(test.x);
			si *= test.y;
		}
		catch(...)
		{
			fSuccess = false;
		}

		if( fSuccess != test.fExpected )
		{
			err_msg( "Error in case uint64_int32 throw: ", test.x, test.y, test.fExpected );
		}
		test = tests.GetNext();
	}
}